

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O1

void md5_update_uv_s16(com_md5_t *md5,void *buf_t,u32 len,int offset)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  u8 t [81960];
  undefined4 uStack_14058;
  
  uVar3 = md5->bits[0];
  uVar1 = len * 2;
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      *(undefined1 *)((long)&uStack_14058 + uVar4) =
           *(undefined1 *)((long)buf_t + uVar4 + (uint)offset);
      *(undefined1 *)((long)&uStack_14058 + uVar4 + 1) = 0;
      uVar4 = uVar4 + 2;
    } while (uVar4 < uVar1);
  }
  uVar5 = uVar3 >> 3 & 0x3f;
  uVar4 = (ulong)uVar5;
  md5->bits[0] = uVar3 + len * 0x10;
  if (CARRY4(uVar3,len * 0x10)) {
    md5->bits[1] = md5->bits[1] + 1;
  }
  md5->bits[1] = md5->bits[1] + (uVar1 >> 0x1d);
  uVar3 = 0x40 - uVar5;
  if (uVar1 < uVar3) {
    uVar3 = 0;
  }
  else {
    memcpy(md5->msg + uVar4,&uStack_14058,(ulong)uVar3);
    com_md5_trans(md5->h,(u32 *)md5->msg);
    uVar2 = uVar5 ^ 0x7f;
    if ((uVar5 ^ 0x7f) < uVar1) {
      do {
        uVar3 = uVar2;
        com_md5_trans(md5->h,(u32 *)((long)&uStack_14058 + (ulong)(uVar3 - 0x3f)));
        uVar2 = uVar3 + 0x40;
      } while (uVar3 + 0x40 < uVar1);
      uVar3 = uVar3 + 1;
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
    }
  }
  if (uVar1 - uVar3 != 0) {
    memcpy(md5->msg + uVar4,(void *)((long)&uStack_14058 + (ulong)uVar3),(ulong)(uVar1 - uVar3));
  }
  return;
}

Assistant:

static void md5_update_uv_s16(com_md5_t *md5, void *buf_t, u32 len, int offset)
{
    u8 *buf;
    u32 i, idx, part_len, j;
    u8 t[8196 * 10];
    buf = (u8 *)buf_t + offset;
    idx = (u32)((md5->bits[0] >> 3) & 0x3f);
    len = len * 2;
    for (j = 0; j < len; j += 2) {
        t[j] = buf[j];
        t[j + 1] = 0;
    }
    md5->bits[0] += (len << 3);
    if (md5->bits[0] < (len << 3)) {
        (md5->bits[1])++;
    }
    md5->bits[1] += (len >> 29);
    part_len = 64 - idx;
    if (len >= part_len) {
        memcpy(md5->msg + idx, t, part_len);
        com_md5_trans(md5->h, (u32 *)md5->msg);
        for (i = part_len; i + 63 < len; i += 64) {
            com_md5_trans(md5->h, (u32 *)(t + i));
        }
        idx = 0;
    } else {
        i = 0;
    }
    if (len - i > 0) {
        memcpy(md5->msg + idx, t + i, len - i);
    }
}